

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall Lowerer::LowerLdLen(Lowerer *this,Instr *instr,bool isHelper)

{
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  undefined4 *puVar4;
  PropertySym *sym;
  SymOpnd *newSrc;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x24c9,"(instr)","instr");
    if (!bVar2) goto LAB_005a83ab;
    *puVar4 = 0;
  }
  if (instr->m_opcode != LdLen_A) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x24ca,"(instr->m_opcode == Js::OpCode::LdLen_A)",
                       "instr->m_opcode == Js::OpCode::LdLen_A");
    if (!bVar2) goto LAB_005a83ab;
    *puVar4 = 0;
  }
  OVar3 = IR::Opnd::GetKind(instr->m_src1);
  if (OVar3 == OpndKindReg) {
    this_00 = instr->m_src1;
    OVar3 = IR::Opnd::GetKind(this_00);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar2) {
LAB_005a83ab:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    sym = PropertySym::FindOrCreate
                    (*(SymID *)(this_00[1]._vptr_Opnd + 2),0xd1,0xffffffff,0xffffffff,
                     PropertyKindData,this->m_func);
    newSrc = IR::SymOpnd::New(&sym->super_Sym,TyVar,this->m_func);
    IR::Instr::ReplaceSrc1(instr,&newSrc->super_Opnd);
  }
  LowerLdFld(this,instr,HelperOp_GetProperty,HelperOp_GetProperty,false,(LabelInstr *)0x0,isHelper);
  return;
}

Assistant:

void Lowerer::LowerLdLen(IR::Instr *const instr, const bool isHelper)
{
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::LdLen_A);

    // LdLen has persisted to this point for the sake of pre-lower opts.
    // Turn it into a LdFld of the "length" property.
    // This is normally a load of the internal "length" of an Array, so it probably doesn't benefit
    // from inline caching.

    if (instr->GetSrc1()->IsRegOpnd())
    {
        IR::RegOpnd * baseOpnd = instr->GetSrc1()->AsRegOpnd();
        PropertySym* fieldSym = PropertySym::FindOrCreate(baseOpnd->m_sym->m_id, Js::PropertyIds::length, (uint32)-1, (uint)-1, PropertyKindData, m_func);
        instr->ReplaceSrc1(IR::SymOpnd::New(fieldSym, TyVar, m_func));
    }
    LowerLdFld(instr, IR::HelperOp_GetProperty, IR::HelperOp_GetProperty, false, nullptr, isHelper);
}